

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined4 uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27a1;
  undefined8 local_27a0;
  float fStack_2798;
  float fStack_2794;
  undefined1 local_2790 [16];
  ulong local_2778;
  size_t local_2770;
  RayHitK<4> *local_2768;
  undefined1 local_2760 [16];
  Scene *local_2750;
  undefined8 uStack_2748;
  undefined1 local_2740 [16];
  long local_2728;
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 (*local_26e8) [16];
  long local_26e0;
  ulong local_26d8;
  RTCFilterFunctionNArguments local_26d0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [16];
  undefined1 *local_2670;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [2] [16];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  RTCHitN local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar18;
  
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar14;
  local_23c0._0_4_ = uVar14;
  local_23c0._8_4_ = uVar14;
  local_23c0._12_4_ = uVar14;
  local_23c0._16_4_ = uVar14;
  local_23c0._20_4_ = uVar14;
  local_23c0._24_4_ = uVar14;
  local_23c0._28_4_ = uVar14;
  auVar78 = ZEXT3264(local_23c0);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar14;
  local_23e0._0_4_ = uVar14;
  local_23e0._8_4_ = uVar14;
  local_23e0._12_4_ = uVar14;
  local_23e0._16_4_ = uVar14;
  local_23e0._20_4_ = uVar14;
  local_23e0._24_4_ = uVar14;
  local_23e0._28_4_ = uVar14;
  auVar80 = ZEXT3264(local_23e0);
  uVar14 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar14;
  local_2400._0_4_ = uVar14;
  local_2400._8_4_ = uVar14;
  local_2400._12_4_ = uVar14;
  local_2400._16_4_ = uVar14;
  local_2400._20_4_ = uVar14;
  local_2400._24_4_ = uVar14;
  local_2400._28_4_ = uVar14;
  auVar81 = ZEXT3264(local_2400);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar124 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar82 = fVar102 * 0.99999964;
  fVar92 = fVar115 * 0.99999964;
  fVar95 = fVar124 * 0.99999964;
  fVar102 = fVar102 * 1.0000004;
  fVar115 = fVar115 * 1.0000004;
  fVar124 = fVar124 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = uVar25 ^ 0x20;
  uVar26 = local_26d8 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_25e0._4_4_ = iVar1;
  local_25e0._0_4_ = iVar1;
  local_25e0._8_4_ = iVar1;
  local_25e0._12_4_ = iVar1;
  local_25e0._16_4_ = iVar1;
  local_25e0._20_4_ = iVar1;
  local_25e0._24_4_ = iVar1;
  local_25e0._28_4_ = iVar1;
  auVar74 = ZEXT3264(local_25e0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar35 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_26e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2420 = fVar82;
  fStack_241c = fVar82;
  fStack_2418 = fVar82;
  fStack_2414 = fVar82;
  fStack_2410 = fVar82;
  fStack_240c = fVar82;
  fStack_2408 = fVar82;
  fStack_2404 = fVar82;
  local_2440 = fVar92;
  fStack_243c = fVar92;
  fStack_2438 = fVar92;
  fStack_2434 = fVar92;
  fStack_2430 = fVar92;
  fStack_242c = fVar92;
  fStack_2428 = fVar92;
  fStack_2424 = fVar92;
  local_2460 = fVar95;
  fStack_245c = fVar95;
  fStack_2458 = fVar95;
  fStack_2454 = fVar95;
  fStack_2450 = fVar95;
  fStack_244c = fVar95;
  fStack_2448 = fVar95;
  fStack_2444 = fVar95;
  local_2480 = fVar102;
  fStack_247c = fVar102;
  fStack_2478 = fVar102;
  fStack_2474 = fVar102;
  fStack_2470 = fVar102;
  fStack_246c = fVar102;
  fStack_2468 = fVar102;
  fStack_2464 = fVar102;
  local_24a0 = fVar115;
  fStack_249c = fVar115;
  fStack_2498 = fVar115;
  fStack_2494 = fVar115;
  fStack_2490 = fVar115;
  fStack_248c = fVar115;
  fStack_2488 = fVar115;
  fStack_2484 = fVar115;
  local_24c0 = fVar124;
  fStack_24bc = fVar124;
  fStack_24b8 = fVar124;
  fStack_24b4 = fVar124;
  fStack_24b0 = fVar124;
  fStack_24ac = fVar124;
  fStack_24a8 = fVar124;
  fStack_24a4 = fVar124;
  fVar86 = fVar82;
  fVar87 = fVar82;
  fVar88 = fVar82;
  fVar89 = fVar82;
  fVar90 = fVar82;
  fVar91 = fVar82;
  fVar103 = fVar92;
  fVar107 = fVar92;
  fVar109 = fVar92;
  fVar111 = fVar92;
  fVar93 = fVar92;
  fVar94 = fVar92;
  fVar96 = fVar95;
  fVar97 = fVar95;
  fVar98 = fVar95;
  fVar99 = fVar95;
  fVar100 = fVar95;
  fVar101 = fVar95;
  fVar106 = fVar102;
  fVar108 = fVar102;
  fVar110 = fVar102;
  fVar112 = fVar102;
  fVar113 = fVar102;
  fVar114 = fVar102;
  fVar118 = fVar115;
  fVar119 = fVar115;
  fVar120 = fVar115;
  fVar121 = fVar115;
  fVar122 = fVar115;
  fVar123 = fVar115;
  fVar125 = fVar124;
  fVar126 = fVar124;
  fVar127 = fVar124;
  fVar128 = fVar124;
  fVar129 = fVar124;
  fVar130 = fVar124;
  local_2778 = uVar25;
  local_2770 = k;
  local_2768 = ray;
LAB_0166471c:
  do {
    do {
      if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar20 = pauVar28 + -1;
      pauVar28 = pauVar28 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar20 + 8));
    uVar21 = *(ulong *)*pauVar28;
    while ((uVar21 & 8) == 0) {
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar43._4_4_ = uVar14;
      auVar43._0_4_ = uVar14;
      auVar43._8_4_ = uVar14;
      auVar43._12_4_ = uVar14;
      auVar43._16_4_ = uVar14;
      auVar43._20_4_ = uVar14;
      auVar43._24_4_ = uVar14;
      auVar43._28_4_ = uVar14;
      uVar15 = uVar21 & 0xfffffffffffffff0;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar25),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar25));
      auVar7 = vsubps_avx(ZEXT1632(auVar36),auVar78._0_32_);
      auVar8._4_4_ = fVar86 * auVar7._4_4_;
      auVar8._0_4_ = fVar82 * auVar7._0_4_;
      auVar8._8_4_ = fVar87 * auVar7._8_4_;
      auVar8._12_4_ = fVar88 * auVar7._12_4_;
      auVar8._16_4_ = fVar89 * auVar7._16_4_;
      auVar8._20_4_ = fVar90 * auVar7._20_4_;
      auVar8._24_4_ = fVar91 * auVar7._24_4_;
      auVar8._28_4_ = auVar7._28_4_;
      auVar7 = vmaxps_avx(auVar74._0_32_,auVar8);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar24),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar24));
      auVar8 = vsubps_avx(ZEXT1632(auVar36),auVar80._0_32_);
      auVar6._4_4_ = fVar103 * auVar8._4_4_;
      auVar6._0_4_ = fVar92 * auVar8._0_4_;
      auVar6._8_4_ = fVar107 * auVar8._8_4_;
      auVar6._12_4_ = fVar109 * auVar8._12_4_;
      auVar6._16_4_ = fVar111 * auVar8._16_4_;
      auVar6._20_4_ = fVar93 * auVar8._20_4_;
      auVar6._24_4_ = fVar94 * auVar8._24_4_;
      auVar6._28_4_ = auVar8._28_4_;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + local_26d8),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + local_26d8));
      auVar8 = vsubps_avx(ZEXT1632(auVar36),auVar81._0_32_);
      auVar10._4_4_ = fVar96 * auVar8._4_4_;
      auVar10._0_4_ = fVar95 * auVar8._0_4_;
      auVar10._8_4_ = fVar97 * auVar8._8_4_;
      auVar10._12_4_ = fVar98 * auVar8._12_4_;
      auVar10._16_4_ = fVar99 * auVar8._16_4_;
      auVar10._20_4_ = fVar100 * auVar8._20_4_;
      auVar10._24_4_ = fVar101 * auVar8._24_4_;
      auVar10._28_4_ = auVar8._28_4_;
      auVar8 = vmaxps_avx(auVar6,auVar10);
      local_26a0 = vmaxps_avx(auVar7,auVar8);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar27),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar27));
      auVar7 = vsubps_avx(ZEXT1632(auVar36),auVar78._0_32_);
      auVar11._4_4_ = fVar106 * auVar7._4_4_;
      auVar11._0_4_ = fVar102 * auVar7._0_4_;
      auVar11._8_4_ = fVar108 * auVar7._8_4_;
      auVar11._12_4_ = fVar110 * auVar7._12_4_;
      auVar11._16_4_ = fVar112 * auVar7._16_4_;
      auVar11._20_4_ = fVar113 * auVar7._20_4_;
      auVar11._24_4_ = fVar114 * auVar7._24_4_;
      auVar11._28_4_ = auVar7._28_4_;
      auVar7 = vminps_avx(auVar35._0_32_,auVar11);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + (uVar24 ^ 0x20)),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + (uVar24 ^ 0x20)));
      auVar8 = vsubps_avx(ZEXT1632(auVar36),auVar80._0_32_);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar15 + 0x100 + uVar26),auVar43,
                                *(undefined1 (*) [32])(uVar15 + 0x40 + uVar26));
      auVar12._4_4_ = fVar118 * auVar8._4_4_;
      auVar12._0_4_ = fVar115 * auVar8._0_4_;
      auVar12._8_4_ = fVar119 * auVar8._8_4_;
      auVar12._12_4_ = fVar120 * auVar8._12_4_;
      auVar12._16_4_ = fVar121 * auVar8._16_4_;
      auVar12._20_4_ = fVar122 * auVar8._20_4_;
      auVar12._24_4_ = fVar123 * auVar8._24_4_;
      auVar12._28_4_ = auVar8._28_4_;
      auVar8 = vsubps_avx(ZEXT1632(auVar36),auVar81._0_32_);
      auVar13._4_4_ = fVar125 * auVar8._4_4_;
      auVar13._0_4_ = fVar124 * auVar8._0_4_;
      auVar13._8_4_ = fVar126 * auVar8._8_4_;
      auVar13._12_4_ = fVar127 * auVar8._12_4_;
      auVar13._16_4_ = fVar128 * auVar8._16_4_;
      auVar13._20_4_ = fVar129 * auVar8._20_4_;
      auVar13._24_4_ = fVar130 * auVar8._24_4_;
      auVar13._28_4_ = auVar8._28_4_;
      auVar8 = vminps_avx(auVar12,auVar13);
      auVar7 = vminps_avx(auVar7,auVar8);
      auVar7 = vcmpps_avx(local_26a0,auVar7,2);
      if (((uint)uVar21 & 7) == 6) {
        auVar8 = vcmpps_avx(*(undefined1 (*) [32])(uVar15 + 0x1c0),auVar43,2);
        auVar6 = vcmpps_avx(auVar43,*(undefined1 (*) [32])(uVar15 + 0x1e0),1);
        auVar8 = vandps_avx(auVar8,auVar6);
        auVar7 = vandps_avx(auVar8,auVar7);
        auVar36 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      else {
        auVar36 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
      }
      auVar36 = vpsllw_avx(auVar36,0xf);
      if ((((((((auVar36 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar36 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar36 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar36 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar36 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar36 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar36 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar36[0xf])
      goto LAB_0166471c;
      auVar36 = vpacksswb_avx(auVar36,auVar36);
      bVar9 = SUB161(auVar36 >> 7,0) & 1 | (SUB161(auVar36 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar36 >> 0x17,0) & 1) << 2 | (SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar36 >> 0x27,0) & 1) << 4 | (SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar36 >> 0x37,0) & 1) << 6 | SUB161(auVar36 >> 0x3f,0) << 7;
      lVar16 = 0;
      for (uVar21 = (ulong)bVar9; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar21 = *(ulong *)(uVar15 + lVar16 * 8);
      uVar17 = bVar9 - 1 & (uint)bVar9;
      uVar18 = (ulong)uVar17;
      if (uVar17 != 0) {
        uVar3 = *(uint *)(local_26a0 + lVar16 * 4);
        lVar16 = 0;
        for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar17 = uVar17 - 1 & uVar17;
        uVar19 = (ulong)uVar17;
        uVar18 = *(ulong *)(uVar15 + lVar16 * 8);
        uVar4 = *(uint *)(local_26a0 + lVar16 * 4);
        if (uVar17 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*pauVar28 = uVar18;
            *(uint *)(*pauVar28 + 8) = uVar4;
            pauVar28 = pauVar28 + 1;
          }
          else {
            *(ulong *)*pauVar28 = uVar21;
            *(uint *)(*pauVar28 + 8) = uVar3;
            uVar21 = uVar18;
            pauVar28 = pauVar28 + 1;
          }
        }
        else {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar21;
          auVar36 = vpunpcklqdq_avx(auVar36,ZEXT416(uVar3));
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar18;
          auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar4));
          lVar16 = 0;
          for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar16 = lVar16 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          uVar21 = (ulong)uVar17;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
          auVar37 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_26a0 + lVar16 * 4)));
          auVar52 = vpcmpgtd_avx(auVar44,auVar36);
          if (uVar17 == 0) {
            auVar64 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar44,auVar36,auVar64);
            auVar36 = vblendvps_avx(auVar36,auVar44,auVar64);
            auVar44 = vpcmpgtd_avx(auVar37,auVar52);
            auVar64 = vpshufd_avx(auVar44,0xaa);
            auVar44 = vblendvps_avx(auVar37,auVar52,auVar64);
            auVar52 = vblendvps_avx(auVar52,auVar37,auVar64);
            auVar37 = vpcmpgtd_avx(auVar52,auVar36);
            auVar64 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar52,auVar36,auVar64);
            auVar36 = vblendvps_avx(auVar36,auVar52,auVar64);
            *pauVar28 = auVar36;
            pauVar28[1] = auVar37;
            uVar21 = auVar44._0_8_;
            pauVar28 = pauVar28 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar21 = (ulong)uVar17;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
            auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_26a0 + lVar16 * 4)));
            if (uVar17 == 0) {
              auVar40 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar44,auVar36,auVar40);
              auVar36 = vblendvps_avx(auVar36,auVar44,auVar40);
              auVar44 = vpcmpgtd_avx(auVar64,auVar37);
              auVar40 = vpshufd_avx(auVar44,0xaa);
              auVar44 = vblendvps_avx(auVar64,auVar37,auVar40);
              auVar37 = vblendvps_avx(auVar37,auVar64,auVar40);
              auVar64 = vpcmpgtd_avx(auVar37,auVar36);
              auVar40 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar37,auVar36,auVar40);
              auVar36 = vblendvps_avx(auVar36,auVar37,auVar40);
              auVar37 = vpcmpgtd_avx(auVar44,auVar52);
              auVar40 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar44,auVar52,auVar40);
              auVar44 = vblendvps_avx(auVar52,auVar44,auVar40);
              auVar52 = vpcmpgtd_avx(auVar64,auVar44);
              auVar40 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar64,auVar44,auVar40);
              auVar44 = vblendvps_avx(auVar44,auVar64,auVar40);
              *pauVar28 = auVar36;
              pauVar28[1] = auVar44;
              pauVar28[2] = auVar52;
              uVar21 = auVar37._0_8_;
              pauVar20 = pauVar28 + 3;
            }
            else {
              *pauVar28 = auVar36;
              pauVar28[1] = auVar44;
              pauVar28[2] = auVar37;
              pauVar20 = pauVar28 + 3;
              pauVar28[3] = auVar64;
              do {
                lVar16 = 0;
                for (uVar25 = uVar21; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar15 + lVar16 * 8);
                auVar36 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_26a0 + lVar16 * 4)));
                pauVar20[1] = auVar36;
                pauVar20 = pauVar20 + 1;
                uVar21 = uVar21 - 1 & uVar21;
              } while (uVar21 != 0);
              lVar16 = 0;
              while (pauVar20 != pauVar28) {
                auVar36 = pauVar28[1];
                uVar17 = vextractps_avx(auVar36,2);
                for (lVar23 = 0x10;
                    (lVar16 != lVar23 && (*(uint *)(pauVar28[-1] + lVar23 + 8) < uVar17));
                    lVar23 = lVar23 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar28 + lVar23) =
                       *(undefined1 (*) [16])(pauVar28[-1] + lVar23);
                }
                *(undefined1 (*) [16])(*pauVar28 + lVar23) = auVar36;
                lVar16 = lVar16 + -0x10;
                pauVar28 = pauVar28 + 1;
              }
              uVar21 = *(ulong *)*pauVar20;
              k = local_2770;
              ray = local_2768;
              uVar25 = local_2778;
            }
            auVar74 = ZEXT3264(local_25e0);
            pauVar28 = pauVar20;
          }
        }
      }
    }
    local_26e0 = (ulong)((uint)uVar21 & 0xf) - 8;
    uVar21 = uVar21 & 0xfffffffffffffff0;
    for (lVar16 = 0; lVar16 != local_26e0; lVar16 = lVar16 + 1) {
      lVar23 = lVar16 * 0x140;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar56._4_4_ = uVar14;
      auVar56._0_4_ = uVar14;
      auVar56._8_4_ = uVar14;
      auVar56._12_4_ = uVar14;
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + lVar23));
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x10 + lVar23));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + lVar23));
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x30 + lVar23));
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x40 + lVar23));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xe0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x50 + lVar23));
      auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xf0 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x60 + lVar23));
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x100 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x70 + lVar23));
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x110 + lVar23),auVar56,
                                *(undefined1 (*) [16])(uVar21 + 0x80 + lVar23));
      uVar14 = *(undefined4 *)(ray + k * 4);
      auVar57._4_4_ = uVar14;
      auVar57._0_4_ = uVar14;
      auVar57._8_4_ = uVar14;
      auVar57._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar104._4_4_ = uVar14;
      auVar104._0_4_ = uVar14;
      auVar104._8_4_ = uVar14;
      auVar104._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar116._4_4_ = uVar14;
      auVar116._0_4_ = uVar14;
      auVar116._8_4_ = uVar14;
      auVar116._12_4_ = uVar14;
      local_2760 = vsubps_avx(auVar36,auVar57);
      auVar52 = vsubps_avx(auVar44,auVar104);
      auVar36 = vsubps_avx(auVar37,auVar116);
      auVar44 = vsubps_avx(auVar64,auVar57);
      auVar37 = vsubps_avx(auVar40,auVar104);
      auVar64 = vsubps_avx(auVar39,auVar116);
      auVar40 = vsubps_avx(auVar46,auVar57);
      auVar39 = vsubps_avx(auVar58,auVar104);
      auVar46 = vsubps_avx(auVar56,auVar116);
      local_2560 = vsubps_avx(auVar40,local_2760);
      local_2580 = vsubps_avx(auVar39,auVar52);
      local_2570 = vsubps_avx(auVar46,auVar36);
      auVar29._0_4_ = auVar40._0_4_ + local_2760._0_4_;
      auVar29._4_4_ = auVar40._4_4_ + local_2760._4_4_;
      auVar29._8_4_ = auVar40._8_4_ + local_2760._8_4_;
      auVar29._12_4_ = auVar40._12_4_ + local_2760._12_4_;
      auVar53._0_4_ = auVar39._0_4_ + auVar52._0_4_;
      auVar53._4_4_ = auVar39._4_4_ + auVar52._4_4_;
      auVar53._8_4_ = auVar39._8_4_ + auVar52._8_4_;
      auVar53._12_4_ = auVar39._12_4_ + auVar52._12_4_;
      fVar102 = auVar36._0_4_;
      auVar58._0_4_ = auVar46._0_4_ + fVar102;
      fVar115 = auVar36._4_4_;
      auVar58._4_4_ = auVar46._4_4_ + fVar115;
      fVar124 = auVar36._8_4_;
      auVar58._8_4_ = auVar46._8_4_ + fVar124;
      fVar82 = auVar36._12_4_;
      auVar58._12_4_ = auVar46._12_4_ + fVar82;
      auVar105._0_4_ = auVar53._0_4_ * local_2570._0_4_;
      auVar105._4_4_ = auVar53._4_4_ * local_2570._4_4_;
      auVar105._8_4_ = auVar53._8_4_ * local_2570._8_4_;
      auVar105._12_4_ = auVar53._12_4_ * local_2570._12_4_;
      auVar56 = vfmsub231ps_fma(auVar105,local_2580,auVar58);
      auVar59._0_4_ = auVar58._0_4_ * local_2560._0_4_;
      auVar59._4_4_ = auVar58._4_4_ * local_2560._4_4_;
      auVar59._8_4_ = auVar58._8_4_ * local_2560._8_4_;
      auVar59._12_4_ = auVar58._12_4_ * local_2560._12_4_;
      auVar58 = vfmsub231ps_fma(auVar59,local_2570,auVar29);
      auVar30._0_4_ = local_2580._0_4_ * auVar29._0_4_;
      auVar30._4_4_ = local_2580._4_4_ * auVar29._4_4_;
      auVar30._8_4_ = local_2580._8_4_ * auVar29._8_4_;
      auVar30._12_4_ = local_2580._12_4_ * auVar29._12_4_;
      auVar29 = vfmsub231ps_fma(auVar30,local_2560,auVar53);
      local_27a0._4_4_ = *(float *)(ray + k * 4 + 0x60);
      auVar79._0_4_ = local_27a0._4_4_ * auVar29._0_4_;
      auVar79._4_4_ = local_27a0._4_4_ * auVar29._4_4_;
      auVar79._8_4_ = local_27a0._4_4_ * auVar29._8_4_;
      auVar79._12_4_ = local_27a0._4_4_ * auVar29._12_4_;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x50);
      local_2790._4_4_ = uVar14;
      local_2790._0_4_ = uVar14;
      local_2790._8_4_ = uVar14;
      local_2790._12_4_ = uVar14;
      auVar58 = vfmadd231ps_fma(auVar79,local_2790,auVar58);
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar117._4_4_ = uVar14;
      auVar117._0_4_ = uVar14;
      auVar117._8_4_ = uVar14;
      auVar117._12_4_ = uVar14;
      local_25b0 = vfmadd231ps_fma(auVar58,auVar117,auVar56);
      local_2590 = vsubps_avx(auVar52,auVar37);
      local_25a0 = vsubps_avx(auVar36,auVar64);
      auVar54._0_4_ = auVar52._0_4_ + auVar37._0_4_;
      auVar54._4_4_ = auVar52._4_4_ + auVar37._4_4_;
      auVar54._8_4_ = auVar52._8_4_ + auVar37._8_4_;
      auVar54._12_4_ = auVar52._12_4_ + auVar37._12_4_;
      auVar60._0_4_ = fVar102 + auVar64._0_4_;
      auVar60._4_4_ = fVar115 + auVar64._4_4_;
      auVar60._8_4_ = fVar124 + auVar64._8_4_;
      auVar60._12_4_ = fVar82 + auVar64._12_4_;
      fVar92 = local_25a0._0_4_;
      auVar68._0_4_ = auVar54._0_4_ * fVar92;
      fVar86 = local_25a0._4_4_;
      auVar68._4_4_ = auVar54._4_4_ * fVar86;
      fVar88 = local_25a0._8_4_;
      auVar68._8_4_ = auVar54._8_4_ * fVar88;
      fVar90 = local_25a0._12_4_;
      auVar68._12_4_ = auVar54._12_4_ * fVar90;
      auVar56 = vfmsub231ps_fma(auVar68,local_2590,auVar60);
      auVar58 = vsubps_avx(local_2760,auVar44);
      fVar95 = auVar58._0_4_;
      auVar75._0_4_ = auVar60._0_4_ * fVar95;
      fVar87 = auVar58._4_4_;
      auVar75._4_4_ = auVar60._4_4_ * fVar87;
      fVar89 = auVar58._8_4_;
      auVar75._8_4_ = auVar60._8_4_ * fVar89;
      fVar91 = auVar58._12_4_;
      auVar75._12_4_ = auVar60._12_4_ * fVar91;
      auVar61._0_4_ = local_2760._0_4_ + auVar44._0_4_;
      auVar61._4_4_ = local_2760._4_4_ + auVar44._4_4_;
      auVar61._8_4_ = local_2760._8_4_ + auVar44._8_4_;
      auVar61._12_4_ = local_2760._12_4_ + auVar44._12_4_;
      auVar36 = vfmsub231ps_fma(auVar75,local_25a0,auVar61);
      fVar103 = local_2590._0_4_;
      auVar62._0_4_ = fVar103 * auVar61._0_4_;
      fVar107 = local_2590._4_4_;
      auVar62._4_4_ = fVar107 * auVar61._4_4_;
      fVar109 = local_2590._8_4_;
      auVar62._8_4_ = fVar109 * auVar61._8_4_;
      fVar111 = local_2590._12_4_;
      auVar62._12_4_ = fVar111 * auVar61._12_4_;
      auVar29 = vfmsub231ps_fma(auVar62,auVar58,auVar54);
      auVar63._0_4_ = local_27a0._4_4_ * auVar29._0_4_;
      auVar63._4_4_ = local_27a0._4_4_ * auVar29._4_4_;
      auVar63._8_4_ = local_27a0._4_4_ * auVar29._8_4_;
      auVar63._12_4_ = local_27a0._4_4_ * auVar29._12_4_;
      auVar36 = vfmadd231ps_fma(auVar63,local_2790,auVar36);
      local_26a0._16_16_ = vfmadd231ps_fma(auVar36,auVar117,auVar56);
      auVar56 = vsubps_avx(auVar44,auVar40);
      auVar45._0_4_ = auVar44._0_4_ + auVar40._0_4_;
      auVar45._4_4_ = auVar44._4_4_ + auVar40._4_4_;
      auVar45._8_4_ = auVar44._8_4_ + auVar40._8_4_;
      auVar45._12_4_ = auVar44._12_4_ + auVar40._12_4_;
      auVar40 = vsubps_avx(auVar37,auVar39);
      auVar38._0_4_ = auVar37._0_4_ + auVar39._0_4_;
      auVar38._4_4_ = auVar37._4_4_ + auVar39._4_4_;
      auVar38._8_4_ = auVar37._8_4_ + auVar39._8_4_;
      auVar38._12_4_ = auVar37._12_4_ + auVar39._12_4_;
      auVar37 = vsubps_avx(auVar64,auVar46);
      auVar65._0_4_ = auVar64._0_4_ + auVar46._0_4_;
      auVar65._4_4_ = auVar64._4_4_ + auVar46._4_4_;
      auVar65._8_4_ = auVar64._8_4_ + auVar46._8_4_;
      auVar65._12_4_ = auVar64._12_4_ + auVar46._12_4_;
      auVar69._0_4_ = auVar37._0_4_ * auVar38._0_4_;
      auVar69._4_4_ = auVar37._4_4_ * auVar38._4_4_;
      auVar69._8_4_ = auVar37._8_4_ * auVar38._8_4_;
      auVar69._12_4_ = auVar37._12_4_ * auVar38._12_4_;
      auVar44 = vfmsub231ps_fma(auVar69,auVar40,auVar65);
      auVar66._0_4_ = auVar65._0_4_ * auVar56._0_4_;
      auVar66._4_4_ = auVar65._4_4_ * auVar56._4_4_;
      auVar66._8_4_ = auVar65._8_4_ * auVar56._8_4_;
      auVar66._12_4_ = auVar65._12_4_ * auVar56._12_4_;
      auVar36 = vfmsub231ps_fma(auVar66,auVar37,auVar45);
      auVar46._0_4_ = auVar40._0_4_ * auVar45._0_4_;
      auVar46._4_4_ = auVar40._4_4_ * auVar45._4_4_;
      auVar46._8_4_ = auVar40._8_4_ * auVar45._8_4_;
      auVar46._12_4_ = auVar40._12_4_ * auVar45._12_4_;
      auVar64 = vfmsub231ps_fma(auVar46,auVar56,auVar38);
      local_27a0._0_4_ = local_27a0._4_4_;
      fStack_2798 = local_27a0._4_4_;
      fStack_2794 = local_27a0._4_4_;
      auVar47._0_4_ = local_27a0._4_4_ * auVar64._0_4_;
      auVar47._4_4_ = local_27a0._4_4_ * auVar64._4_4_;
      auVar47._8_4_ = local_27a0._4_4_ * auVar64._8_4_;
      auVar47._12_4_ = local_27a0._4_4_ * auVar64._12_4_;
      auVar36 = vfmadd231ps_fma(auVar47,local_2790,auVar36);
      auVar64 = vfmadd231ps_fma(auVar36,auVar117,auVar44);
      local_2680._0_4_ = auVar64._0_4_ + local_25b0._0_4_ + local_26a0._16_4_;
      local_2680._4_4_ = auVar64._4_4_ + local_25b0._4_4_ + local_26a0._20_4_;
      local_2680._8_4_ = auVar64._8_4_ + local_25b0._8_4_ + local_26a0._24_4_;
      local_2680._12_4_ = auVar64._12_4_ + local_25b0._12_4_ + local_26a0._28_4_;
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      auVar36 = vminps_avx(local_25b0,local_26a0._16_16_);
      auVar36 = vminps_avx(auVar36,auVar64);
      local_25c0 = vandps_avx(local_2680,auVar39);
      auVar76._0_4_ = local_25c0._0_4_ * 1.1920929e-07;
      auVar76._4_4_ = local_25c0._4_4_ * 1.1920929e-07;
      auVar76._8_4_ = local_25c0._8_4_ * 1.1920929e-07;
      auVar76._12_4_ = local_25c0._12_4_ * 1.1920929e-07;
      uVar15 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
      auVar70._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar70._8_4_ = -auVar76._8_4_;
      auVar70._12_4_ = -auVar76._12_4_;
      auVar36 = vcmpps_avx(auVar36,auVar70,5);
      auVar44 = vmaxps_avx(local_25b0,local_26a0._16_16_);
      auVar44 = vmaxps_avx(auVar44,auVar64);
      auVar44 = vcmpps_avx(auVar44,auVar76,2);
      auVar36 = vorps_avx(auVar36,auVar44);
      if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0'
         ) {
        auVar48._0_4_ = local_2570._0_4_ * fVar103;
        auVar48._4_4_ = local_2570._4_4_ * fVar107;
        auVar48._8_4_ = local_2570._8_4_ * fVar109;
        auVar48._12_4_ = local_2570._12_4_ * fVar111;
        auVar71._0_4_ = fVar95 * local_2580._0_4_;
        auVar71._4_4_ = fVar87 * local_2580._4_4_;
        auVar71._8_4_ = fVar89 * local_2580._8_4_;
        auVar71._12_4_ = fVar91 * local_2580._12_4_;
        auVar64 = vfmsub213ps_fma(local_2580,local_25a0,auVar48);
        auVar67._0_4_ = auVar40._0_4_ * fVar92;
        auVar67._4_4_ = auVar40._4_4_ * fVar86;
        auVar67._8_4_ = auVar40._8_4_ * fVar88;
        auVar67._12_4_ = auVar40._12_4_ * fVar90;
        auVar77._0_4_ = fVar95 * auVar37._0_4_;
        auVar77._4_4_ = fVar87 * auVar37._4_4_;
        auVar77._8_4_ = fVar89 * auVar37._8_4_;
        auVar77._12_4_ = fVar91 * auVar37._12_4_;
        auVar46 = vfmsub213ps_fma(auVar37,local_2590,auVar67);
        auVar44 = vandps_avx(auVar48,auVar39);
        auVar37 = vandps_avx(auVar67,auVar39);
        auVar44 = vcmpps_avx(auVar44,auVar37,1);
        local_2620 = vblendvps_avx(auVar46,auVar64,auVar44);
        auVar83._0_4_ = auVar56._0_4_ * fVar103;
        auVar83._4_4_ = auVar56._4_4_ * fVar107;
        auVar83._8_4_ = auVar56._8_4_ * fVar109;
        auVar83._12_4_ = auVar56._12_4_ * fVar111;
        auVar64 = vfmsub213ps_fma(auVar56,local_25a0,auVar77);
        auVar49._0_4_ = local_2560._0_4_ * fVar92;
        auVar49._4_4_ = local_2560._4_4_ * fVar86;
        auVar49._8_4_ = local_2560._8_4_ * fVar88;
        auVar49._12_4_ = local_2560._12_4_ * fVar90;
        auVar46 = vfmsub213ps_fma(local_2570,auVar58,auVar49);
        auVar44 = vandps_avx(auVar49,auVar39);
        auVar37 = vandps_avx(auVar77,auVar39);
        auVar44 = vcmpps_avx(auVar44,auVar37,1);
        local_2610 = vblendvps_avx(auVar64,auVar46,auVar44);
        auVar64 = vfmsub213ps_fma(local_2560,local_2590,auVar71);
        auVar40 = vfmsub213ps_fma(auVar40,auVar58,auVar83);
        auVar44 = vandps_avx(auVar71,auVar39);
        auVar37 = vandps_avx(auVar83,auVar39);
        auVar44 = vcmpps_avx(auVar44,auVar37,1);
        local_2600[0] = vblendvps_avx(auVar40,auVar64,auVar44);
        auVar40._0_4_ = local_2600[0]._0_4_ * local_27a0._4_4_;
        auVar40._4_4_ = local_2600[0]._4_4_ * local_27a0._4_4_;
        auVar40._8_4_ = local_2600[0]._8_4_ * local_27a0._4_4_;
        auVar40._12_4_ = local_2600[0]._12_4_ * local_27a0._4_4_;
        auVar44 = vfmadd213ps_fma(local_2790,local_2610,auVar40);
        auVar44 = vfmadd213ps_fma(auVar117,local_2620,auVar44);
        auVar41._0_4_ = auVar44._0_4_ + auVar44._0_4_;
        auVar41._4_4_ = auVar44._4_4_ + auVar44._4_4_;
        auVar41._8_4_ = auVar44._8_4_ + auVar44._8_4_;
        auVar41._12_4_ = auVar44._12_4_ + auVar44._12_4_;
        auVar72._0_4_ = local_2600[0]._0_4_ * fVar102;
        auVar72._4_4_ = local_2600[0]._4_4_ * fVar115;
        auVar72._8_4_ = local_2600[0]._8_4_ * fVar124;
        auVar72._12_4_ = local_2600[0]._12_4_ * fVar82;
        auVar44 = vfmadd213ps_fma(auVar52,local_2610,auVar72);
        auVar52 = vfmadd213ps_fma(local_2760,local_2620,auVar44);
        auVar44 = vrcpps_avx(auVar41);
        auVar84._8_4_ = 0x3f800000;
        auVar84._0_8_ = 0x3f8000003f800000;
        auVar84._12_4_ = 0x3f800000;
        auVar37 = vfnmadd213ps_fma(auVar44,auVar41,auVar84);
        auVar44 = vfmadd132ps_fma(auVar37,auVar44,auVar44);
        local_2630._0_4_ = auVar44._0_4_ * (auVar52._0_4_ + auVar52._0_4_);
        local_2630._4_4_ = auVar44._4_4_ * (auVar52._4_4_ + auVar52._4_4_);
        local_2630._8_4_ = auVar44._8_4_ * (auVar52._8_4_ + auVar52._8_4_);
        local_2630._12_4_ = auVar44._12_4_ * (auVar52._12_4_ + auVar52._12_4_);
        auVar35 = ZEXT1664(local_2630);
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar73._4_4_ = uVar14;
        auVar73._0_4_ = uVar14;
        auVar73._8_4_ = uVar14;
        auVar73._12_4_ = uVar14;
        auVar44 = vcmpps_avx(auVar73,local_2630,2);
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar85._4_4_ = uVar14;
        auVar85._0_4_ = uVar14;
        auVar85._8_4_ = uVar14;
        auVar85._12_4_ = uVar14;
        auVar74 = ZEXT1664(auVar85);
        auVar52 = vcmpps_avx(local_2630,auVar85,2);
        auVar44 = vandps_avx(auVar44,auVar52);
        auVar37 = auVar36 & auVar44;
        if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar37[0xf] < '\0') {
          auVar36 = vandps_avx(auVar36,auVar44);
          auVar44 = vcmpps_avx(auVar41,_DAT_01f45a50,4);
          auVar37 = auVar44 & auVar36;
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            local_2740 = vandps_avx(auVar36,auVar44);
            local_26a0._0_16_ = local_25b0;
            local_2670 = &local_27a1;
            local_2660 = local_2740;
            uStack_2748 = auVar117._8_8_;
            local_2750 = context->scene;
            auVar36 = vrcpps_avx(local_2680);
            auVar55._8_4_ = 0x3f800000;
            auVar55._0_8_ = 0x3f8000003f800000;
            auVar55._12_4_ = 0x3f800000;
            auVar44 = vfnmadd213ps_fma(local_2680,auVar36,auVar55);
            auVar44 = vfmadd132ps_fma(auVar44,auVar36,auVar36);
            auVar50._8_4_ = 0x219392ef;
            auVar50._0_8_ = 0x219392ef219392ef;
            auVar50._12_4_ = 0x219392ef;
            auVar36 = vcmpps_avx(local_25c0,auVar50,5);
            auVar36 = vandps_avx(auVar44,auVar36);
            auVar31._0_4_ = local_25b0._0_4_ * auVar36._0_4_;
            auVar31._4_4_ = local_25b0._4_4_ * auVar36._4_4_;
            auVar31._8_4_ = local_25b0._8_4_ * auVar36._8_4_;
            auVar31._12_4_ = local_25b0._12_4_ * auVar36._12_4_;
            local_2650 = vminps_avx(auVar31,auVar55);
            auVar32._0_4_ = auVar36._0_4_ * local_26a0._16_4_;
            auVar32._4_4_ = auVar36._4_4_ * local_26a0._20_4_;
            auVar32._8_4_ = auVar36._8_4_ * local_26a0._24_4_;
            auVar32._12_4_ = auVar36._12_4_ * local_26a0._28_4_;
            local_2640 = vminps_avx(auVar32,auVar55);
            auVar51._8_4_ = 0x7f800000;
            auVar51._0_8_ = 0x7f8000007f800000;
            auVar51._12_4_ = 0x7f800000;
            auVar36 = vblendvps_avx(auVar51,local_2630,local_2740);
            auVar44 = vshufps_avx(auVar36,auVar36,0xb1);
            auVar44 = vminps_avx(auVar44,auVar36);
            auVar37 = vshufpd_avx(auVar44,auVar44,1);
            auVar44 = vminps_avx(auVar37,auVar44);
            auVar36 = vcmpps_avx(auVar36,auVar44,0);
            auVar37 = local_2740 & auVar36;
            auVar44 = vpcmpeqd_avx(auVar44,auVar44);
            if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar37[0xf] < '\0') {
              auVar44 = auVar36;
            }
            auVar36 = vandps_avx(local_2740,auVar44);
            uVar14 = vmovmskps_avx(auVar36);
            lVar22 = 0;
            for (uVar15 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar14); (uVar15 & 1) == 0;
                uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            auVar36 = vpcmpeqd_avx(auVar52,auVar52);
            auVar78 = ZEXT1664(auVar36);
            local_27a0 = lVar23 + uVar21;
            lVar23 = lVar23 + uVar21;
            do {
              uVar17 = *(uint *)(lVar23 + 0x120 + lVar22 * 4);
              uVar15 = (ulong)uVar17;
              lVar23 = *(long *)(*(long *)((long)local_2750 + 0x1e8) + uVar15 * 8);
              local_2790._0_8_ = lVar23;
              if ((*(uint *)(lVar23 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2740 + lVar22 * 4) = 0;
              }
              else {
                local_2760._0_8_ = lVar22;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(lVar23 + 0x40) == 0)) {
                  uVar14 = *(undefined4 *)(local_2650 + lVar22 * 4);
                  uVar2 = *(undefined4 *)(local_2640 + lVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + lVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2620 + lVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2610 + lVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2600[0] + lVar22 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar14;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(local_27a0 + 0x130 + lVar22 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar17;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar14 = *(undefined4 *)(local_2650 + lVar22 * 4);
                local_2520._4_4_ = uVar14;
                local_2520._0_4_ = uVar14;
                local_2520._8_4_ = uVar14;
                local_2520._12_4_ = uVar14;
                local_2510 = *(undefined4 *)(local_2640 + lVar22 * 4);
                local_24f0._4_4_ = uVar17;
                local_24f0._0_4_ = uVar17;
                local_24f0._8_4_ = uVar17;
                local_24f0._12_4_ = uVar17;
                uVar14 = *(undefined4 *)(local_27a0 + 0x130 + lVar22 * 4);
                local_2500._4_4_ = uVar14;
                local_2500._0_4_ = uVar14;
                local_2500._8_4_ = uVar14;
                local_2500._12_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_2620 + lVar22 * 4);
                uVar2 = *(undefined4 *)(local_2610 + lVar22 * 4);
                local_2540._4_4_ = uVar2;
                local_2540._0_4_ = uVar2;
                local_2540._8_4_ = uVar2;
                local_2540._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_2600[0] + lVar22 * 4);
                local_2530._4_4_ = uVar2;
                local_2530._0_4_ = uVar2;
                local_2530._8_4_ = uVar2;
                local_2530._12_4_ = uVar2;
                local_2550[0] = (RTCHitN)(char)uVar14;
                local_2550[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2550[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2550[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2550[4] = (RTCHitN)(char)uVar14;
                local_2550[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2550[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2550[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2550[8] = (RTCHitN)(char)uVar14;
                local_2550[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2550[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2550[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                local_2550[0xc] = (RTCHitN)(char)uVar14;
                local_2550[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
                local_2550[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
                local_2550[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
                uStack_250c = local_2510;
                uStack_2508 = local_2510;
                uStack_2504 = local_2510;
                vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                uStack_24dc = context->user->instID[0];
                local_24e0 = uStack_24dc;
                uStack_24d8 = uStack_24dc;
                uStack_24d4 = uStack_24dc;
                uStack_24d0 = context->user->instPrimID[0];
                uStack_24cc = uStack_24d0;
                uStack_24c8 = uStack_24d0;
                uStack_24c4 = uStack_24d0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2630 + lVar22 * 4);
                local_2700 = *local_26e8;
                local_26d0.valid = (int *)local_2700;
                local_26d0.geometryUserPtr = *(void **)(lVar23 + 0x18);
                local_26d0.context = context->user;
                local_26d0.hit = local_2550;
                local_26d0.N = 4;
                local_2710 = auVar35._0_16_;
                local_2720 = auVar74._0_16_;
                local_2728 = lVar16;
                local_26d0.ray = (RTCRayN *)ray;
                if (*(code **)(lVar23 + 0x40) != (code *)0x0) {
                  auVar36 = auVar78._0_16_;
                  (**(code **)(lVar23 + 0x40))(&local_26d0);
                  auVar74 = ZEXT1664(local_2720);
                  auVar35 = ZEXT1664(local_2710);
                  auVar36 = vpcmpeqd_avx(auVar36,auVar36);
                  auVar78 = ZEXT1664(auVar36);
                  k = local_2770;
                  ray = local_2768;
                  uVar25 = local_2778;
                }
                auVar36 = auVar78._0_16_;
                if (local_2700 == (undefined1  [16])0x0) {
                  auVar44 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar44 = auVar44 ^ auVar36;
                  lVar16 = local_2728;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_2790._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var5)(&local_26d0);
                    auVar74 = ZEXT1664(local_2720);
                    auVar35 = ZEXT1664(local_2710);
                    auVar36 = vpcmpeqd_avx(auVar36,auVar36);
                    auVar78 = ZEXT1664(auVar36);
                    k = local_2770;
                    ray = local_2768;
                    uVar25 = local_2778;
                  }
                  auVar36 = vpcmpeqd_avx(local_2700,_DAT_01f45a50);
                  auVar44 = auVar36 ^ auVar78._0_16_;
                  lVar16 = local_2728;
                  if (local_2700 != (undefined1  [16])0x0) {
                    auVar36 = auVar36 ^ auVar78._0_16_;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])local_26d0.hit);
                    *(undefined1 (*) [16])(local_26d0.ray + 0xc0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x10));
                    *(undefined1 (*) [16])(local_26d0.ray + 0xd0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x20));
                    *(undefined1 (*) [16])(local_26d0.ray + 0xe0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x30));
                    *(undefined1 (*) [16])(local_26d0.ray + 0xf0) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x40));
                    *(undefined1 (*) [16])(local_26d0.ray + 0x100) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x50));
                    *(undefined1 (*) [16])(local_26d0.ray + 0x110) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x60));
                    *(undefined1 (*) [16])(local_26d0.ray + 0x120) = auVar52;
                    auVar52 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x70));
                    *(undefined1 (*) [16])(local_26d0.ray + 0x130) = auVar52;
                    auVar36 = vmaskmovps_avx(auVar36,*(undefined1 (*) [16])(local_26d0.hit + 0x80));
                    *(undefined1 (*) [16])(local_26d0.ray + 0x140) = auVar36;
                  }
                }
                auVar33._8_8_ = 0x100000001;
                auVar33._0_8_ = 0x100000001;
                if ((auVar33 & auVar44) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar74._0_4_;
                }
                else {
                  auVar74 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2740 + local_2760._0_8_ * 4) = 0;
                uVar14 = auVar74._0_4_;
                auVar34._4_4_ = uVar14;
                auVar34._0_4_ = uVar14;
                auVar34._8_4_ = uVar14;
                auVar34._12_4_ = uVar14;
                auVar36 = vcmpps_avx(auVar35._0_16_,auVar34,2);
                local_2740 = vandps_avx(auVar36,local_2740);
                uVar15 = local_2760._0_8_;
              }
              if ((((local_2740 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2740 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2740 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2740[0xf]) break;
              auVar42._8_4_ = 0x7f800000;
              auVar42._0_8_ = 0x7f8000007f800000;
              auVar42._12_4_ = 0x7f800000;
              auVar36 = vblendvps_avx(auVar42,auVar35._0_16_,local_2740);
              auVar44 = vshufps_avx(auVar36,auVar36,0xb1);
              auVar44 = vminps_avx(auVar44,auVar36);
              auVar52 = vshufpd_avx(auVar44,auVar44,1);
              auVar44 = vminps_avx(auVar52,auVar44);
              auVar44 = vcmpps_avx(auVar36,auVar44,0);
              auVar52 = local_2740 & auVar44;
              auVar36 = local_2740;
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar52[0xf] < '\0') {
                auVar36 = vandps_avx(auVar44,local_2740);
              }
              uVar14 = vmovmskps_avx(auVar36);
              lVar22 = 0;
              for (uVar15 = CONCAT44((int)(uVar15 >> 0x20),uVar14); lVar23 = local_27a0,
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
            } while( true );
          }
        }
      }
      auVar78 = ZEXT3264(local_23c0);
      auVar80 = ZEXT3264(local_23e0);
      auVar81 = ZEXT3264(local_2400);
      auVar74 = ZEXT3264(local_25e0);
      fVar82 = local_2420;
      fVar86 = fStack_241c;
      fVar87 = fStack_2418;
      fVar88 = fStack_2414;
      fVar89 = fStack_2410;
      fVar90 = fStack_240c;
      fVar91 = fStack_2408;
      fVar92 = local_2440;
      fVar103 = fStack_243c;
      fVar107 = fStack_2438;
      fVar109 = fStack_2434;
      fVar111 = fStack_2430;
      fVar93 = fStack_242c;
      fVar94 = fStack_2428;
      fVar95 = local_2460;
      fVar96 = fStack_245c;
      fVar97 = fStack_2458;
      fVar98 = fStack_2454;
      fVar99 = fStack_2450;
      fVar100 = fStack_244c;
      fVar101 = fStack_2448;
      fVar102 = local_2480;
      fVar106 = fStack_247c;
      fVar108 = fStack_2478;
      fVar110 = fStack_2474;
      fVar112 = fStack_2470;
      fVar113 = fStack_246c;
      fVar114 = fStack_2468;
      fVar115 = local_24a0;
      fVar118 = fStack_249c;
      fVar119 = fStack_2498;
      fVar120 = fStack_2494;
      fVar121 = fStack_2490;
      fVar122 = fStack_248c;
      fVar123 = fStack_2488;
      fVar124 = local_24c0;
      fVar125 = fStack_24bc;
      fVar126 = fStack_24b8;
      fVar127 = fStack_24b4;
      fVar128 = fStack_24b0;
      fVar129 = fStack_24ac;
      fVar130 = fStack_24a8;
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar35 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }